

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rma(ASMState *as,x86Op xo,Reg rr,void *addr)

{
  MCode *pMVar1;
  int iVar2;
  byte *pbVar3;
  MCode *p;
  void *addr_local;
  Reg rr_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_18;
  
  pMVar1 = as->mcp;
  *(int *)(pMVar1 + -4) = (int)addr;
  pMVar1[-5] = '%';
  pMVar1[-6] = (char)((rr & 7) << 3) + '\x04';
  *(x86Op *)(pMVar1 + -10) = xo;
  pbVar3 = pMVar1 + ((char)xo + -5);
  iVar2 = (rr >> 1 & 0x104) + 0x40;
  local_18 = pbVar3;
  if (iVar2 != 0x40) {
    rex._0_1_ = (byte)(rr >> 0x10) | (byte)iVar2;
    if ((char)xo == -4) {
      *pbVar3 = (byte)rex;
      rex._0_1_ = (byte)(xo >> 8);
    }
    else if ((xo & 0xffffff) == 0x6600fd) {
      *pbVar3 = (byte)rex;
      rex._0_1_ = 0x66;
    }
    local_18 = pbVar3 + -1;
    pbVar3[-1] = (byte)rex;
  }
  as->mcp = local_18;
  return;
}

Assistant:

static void emit_rma(ASMState *as, x86Op xo, Reg rr, const void *addr)
{
  MCode *p = as->mcp;
  *(int32_t *)(p-4) = ptr2addr(addr);
#if LJ_64
  p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
  as->mcp = emit_opm(xo, XM_OFS0, rr, RID_ESP, p, -5);
#else
  as->mcp = emit_opm(xo, XM_OFS0, rr, RID_EBP, p, -4);
#endif
}